

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O1

int trico_read_vec3_double(void *a,double **vertices,trico_stream_type st)

{
  long lVar1;
  int iVar2;
  uint32_t *puVar3;
  uint *puVar4;
  bool bVar5;
  uint8_t *puVar6;
  uint unaff_R12D;
  ulong uVar7;
  int iVar8;
  int iVar9;
  uint32_t nr_of_doubles_z;
  uint32_t nr_of_doubles_y;
  uint32_t nr_of_doubles_x;
  double *decompressed_z;
  double *decompressed_y;
  double *decompressed_x;
  uint local_5c;
  uint32_t local_58;
  uint32_t local_54;
  uint32_t local_50;
  uint32_t local_4c;
  double *local_48;
  double *local_40;
  double *local_38;
  
  iVar8 = 0;
  iVar9 = 0;
  if (*(trico_stream_type *)((long)a + 0x24) == st) {
    iVar2 = *(int *)((long)a + 0x40);
    bVar5 = true;
    if ((iVar2 == 0) &&
       (puVar3 = *(uint32_t **)((long)a + 0x18),
       (ulong)((long)puVar3 + (4 - *(long *)((long)a + 0x10))) <= *(ulong *)((long)a + 0x30))) {
      local_58 = *puVar3;
      *(uint32_t **)((long)a + 0x18) = puVar3 + 1;
      bVar5 = false;
    }
    iVar9 = iVar8;
    if (!bVar5) {
      bVar5 = true;
      local_5c = unaff_R12D;
      if ((iVar2 == 0) &&
         (puVar4 = *(uint **)((long)a + 0x18),
         (ulong)((long)puVar4 + (4 - *(long *)((long)a + 0x10))) <= *(ulong *)((long)a + 0x30))) {
        local_5c = *puVar4;
        *(uint **)((long)a + 0x18) = puVar4 + 1;
        bVar5 = false;
      }
      if (!bVar5) {
        uVar7 = (ulong)local_5c;
        puVar6 = (uint8_t *)malloc(uVar7);
        if (iVar2 == 0) {
          lVar1 = (long)*(void **)((long)a + 0x18) + uVar7;
          if ((ulong)(lVar1 - *(long *)((long)a + 0x10)) <= *(ulong *)((long)a + 0x30)) {
            memcpy(puVar6,*(void **)((long)a + 0x18),uVar7);
            *(long *)((long)a + 0x18) = lVar1;
            trico_decompress_double_precision(&local_4c,&local_38,puVar6);
            iVar8 = *(int *)((long)a + 0x40);
            bVar5 = true;
            if ((iVar8 == 0) &&
               (puVar4 = *(uint **)((long)a + 0x18),
               (ulong)((long)puVar4 + (4 - *(long *)((long)a + 0x10))) <= *(ulong *)((long)a + 0x30)
               )) {
              local_5c = *puVar4;
              *(uint **)((long)a + 0x18) = puVar4 + 1;
              bVar5 = false;
            }
            iVar9 = 0;
            if (!bVar5) {
              uVar7 = (ulong)local_5c;
              puVar6 = (uint8_t *)realloc(puVar6,uVar7);
              if (iVar8 == 0) {
                lVar1 = (long)*(void **)((long)a + 0x18) + uVar7;
                if ((ulong)(lVar1 - *(long *)((long)a + 0x10)) <= *(ulong *)((long)a + 0x30)) {
                  memcpy(puVar6,*(void **)((long)a + 0x18),uVar7);
                  *(long *)((long)a + 0x18) = lVar1;
                  trico_decompress_double_precision(&local_50,&local_40,puVar6);
                  iVar8 = *(int *)((long)a + 0x40);
                  bVar5 = true;
                  if ((iVar8 == 0) &&
                     (puVar4 = *(uint **)((long)a + 0x18),
                     (ulong)((long)puVar4 + (4 - *(long *)((long)a + 0x10))) <=
                     *(ulong *)((long)a + 0x30))) {
                    local_5c = *puVar4;
                    *(uint **)((long)a + 0x18) = puVar4 + 1;
                    bVar5 = false;
                  }
                  iVar9 = 0;
                  if (!bVar5) {
                    uVar7 = (ulong)local_5c;
                    puVar6 = (uint8_t *)realloc(puVar6,uVar7);
                    if (iVar8 == 0) {
                      lVar1 = (long)*(void **)((long)a + 0x18) + uVar7;
                      if ((ulong)(lVar1 - *(long *)((long)a + 0x10)) <= *(ulong *)((long)a + 0x30))
                      {
                        memcpy(puVar6,*(void **)((long)a + 0x18),uVar7);
                        *(long *)((long)a + 0x18) = lVar1;
                        trico_decompress_double_precision(&local_54,&local_48,puVar6);
                        free(puVar6);
                        if (local_4c != local_58) {
                          __assert_fail("nr_of_doubles_x == nr_vertices",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                        ,0x41d,
                                        "int trico_read_vec3_double(void *, double **, enum trico_stream_type)"
                                       );
                        }
                        if (local_4c != local_50) {
                          __assert_fail("nr_of_doubles_x == nr_of_doubles_y",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                        ,0x41e,
                                        "int trico_read_vec3_double(void *, double **, enum trico_stream_type)"
                                       );
                        }
                        if (local_4c != local_54) {
                          __assert_fail("nr_of_doubles_x == nr_of_doubles_z",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                        ,0x41f,
                                        "int trico_read_vec3_double(void *, double **, enum trico_stream_type)"
                                       );
                        }
                        if (vertices != (double **)0x0) {
                          trico_transpose_xyz_soa_to_aos_double_precision
                                    (vertices,local_38,local_40,local_48,local_58);
                        }
                        free(local_38);
                        free(local_40);
                        free(local_48);
                        read_next_stream_type((trico_archive *)a);
                        iVar9 = 1;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar9;
}

Assistant:

static int trico_read_vec3_double(void* a, double** vertices, enum trico_stream_type st)
  {
  struct trico_archive* arch = (struct trico_archive*)a;

  if (trico_get_next_stream_type(arch) != st)
    return 0;

  uint32_t nr_vertices;
  if (!read(&nr_vertices, sizeof(uint32_t), 1, arch))
    return 0;

  uint32_t nr_of_compressed_bytes;
  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  void* compressed = trico_malloc(nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  double* decompressed_x;
  uint32_t nr_of_doubles_x;
  trico_decompress_double_precision(&nr_of_doubles_x, &decompressed_x, (const uint8_t*)compressed);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  double* decompressed_y;
  uint32_t nr_of_doubles_y;
  trico_decompress_double_precision(&nr_of_doubles_y, &decompressed_y, (const uint8_t*)compressed);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  double* decompressed_z;
  uint32_t nr_of_doubles_z;
  trico_decompress_double_precision(&nr_of_doubles_z, &decompressed_z, (const uint8_t*)compressed);
  trico_free(compressed);

  assert(nr_of_doubles_x == nr_vertices);
  assert(nr_of_doubles_x == nr_of_doubles_y);
  assert(nr_of_doubles_x == nr_of_doubles_z);

  if (vertices != NULL)
    trico_transpose_xyz_soa_to_aos_double_precision(vertices, decompressed_x, decompressed_y, decompressed_z, nr_vertices);

  trico_free(decompressed_x);
  trico_free(decompressed_y);
  trico_free(decompressed_z);

  read_next_stream_type(arch);

  return 1;
  }